

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward.hpp
# Opt level: O3

void __thiscall backward::StackTraceImplBase::load_thread_info(StackTraceImplBase *this)

{
  __pid_t _Var1;
  size_t sVar2;
  
  sVar2 = syscall(0xba);
  this->_thread_id = sVar2;
  _Var1 = getpid();
  if (sVar2 == (long)_Var1) {
    this->_thread_id = 0;
  }
  return;
}

Assistant:

void load_thread_info() {
#ifdef BACKWARD_SYSTEM_LINUX
#ifndef __ANDROID__
    _thread_id = static_cast<size_t>(syscall(SYS_gettid));
#else
    _thread_id = static_cast<size_t>(gettid());
#endif
    if (_thread_id == static_cast<size_t>(getpid())) {
      // If the thread is the main one, let's hide that.
      // I like to keep little secret sometimes.
      _thread_id = 0;
    }
#elif defined(BACKWARD_SYSTEM_DARWIN)
    _thread_id = reinterpret_cast<size_t>(pthread_self());
    if (pthread_main_np() == 1) {
      // If the thread is the main one, let's hide that.
      _thread_id = 0;
    }
#endif
  }